

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryImagesLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryImagesLoader::begin__image
          (LibraryImagesLoader *this,image__AttributeData *attributeData)

{
  void *pvVar1;
  long in_RSI;
  long in_RDI;
  ClassId in_stack_0000004c;
  ParserChar *in_stack_00000050;
  IFilePartLoader *in_stack_00000058;
  String *in_stack_fffffffffffffea8;
  Image *in_stack_fffffffffffffeb0;
  Image *this_00;
  UniqueId *in_stack_fffffffffffffed8;
  Image *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [39];
  undefined1 local_81 [40];
  allocator<char> local_59;
  string local_58 [35];
  undefined1 local_35;
  UniqueId local_28;
  long local_10;
  
  local_10 = in_RSI;
  pvVar1 = operator_new(0x180);
  local_35 = 1;
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)381>::ID();
  IFilePartLoader::createUniqueIdFromId(in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  COLLADAFW::Image::Image(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_35 = 0;
  *(void **)(in_RDI + 0x20) = pvVar1;
  COLLADAFW::UniqueId::~UniqueId(&local_28);
  if (*(long *)(local_10 + 0x18) == 0) {
    if (*(long *)(local_10 + 8) != 0) {
      in_stack_fffffffffffffee0 = *(Image **)(in_RDI + 0x20);
      in_stack_fffffffffffffee8 = *(char **)(local_10 + 8);
      in_stack_fffffffffffffef0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_81;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (allocator<char> *)in_stack_fffffffffffffee0);
      COLLADAFW::Image::setName(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::__cxx11::string::~string((string *)(local_81 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_81);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (allocator<char> *)in_stack_fffffffffffffee0);
    COLLADAFW::Image::setName(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  if (*(long *)(local_10 + 8) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (allocator<char> *)in_stack_fffffffffffffee0);
    COLLADAFW::Image::setOriginalId(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  if (*(long *)(local_10 + 0x20) != 0) {
    this_00 = *(Image **)(in_RDI + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (allocator<char> *)in_stack_fffffffffffffee0);
    COLLADAFW::Image::setFormat(this_00,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
  }
  COLLADAFW::Image::setHeight(*(Image **)(in_RDI + 0x20),(uint)*(undefined8 *)(local_10 + 0x28));
  COLLADAFW::Image::setWidth(*(Image **)(in_RDI + 0x20),(uint)*(undefined8 *)(local_10 + 0x30));
  COLLADAFW::Image::setDepth(*(Image **)(in_RDI + 0x20),(uint)*(undefined8 *)(local_10 + 0x38));
  return true;
}

Assistant:

bool LibraryImagesLoader::begin__image( const image__AttributeData& attributeData )
	{
		mCurrentImage = FW_NEW COLLADAFW::Image( createUniqueIdFromId( attributeData.id, COLLADAFW::Image::ID()) );

		if ( attributeData.name )
			mCurrentImage->setName( (const char*) attributeData.name );
		else if ( attributeData.id )
			mCurrentImage->setName( (const char*) attributeData.id );

        if ( attributeData.id )
            mCurrentImage->setOriginalId ( (const char*)attributeData.id );

		if ( attributeData.format )
			mCurrentImage->setFormat( attributeData.format );
		
		mCurrentImage->setHeight( (unsigned long)attributeData.height );
		mCurrentImage->setWidth( (unsigned long)attributeData.width );
		mCurrentImage->setDepth( (unsigned long)attributeData.depth );

		return true;
	}